

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall Analyser::initializeVariable(Analyser *this,char type)

{
  Instruction local_18;
  
  if (type == 'i') {
    local_18._opr = ipush;
    local_18._x = 0;
    local_18._y = 0;
    local_18._paramNum = 1;
    addInstruction(this,&local_18);
  }
  return;
}

Assistant:

void Analyser::initializeVariable(char type) {
	switch (type)
	{
	case 'i':
		addInstruction(Instruction(Operation::ipush, 0));
		break;
	default:
		break;
	}
}